

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O1

StepStatus __thiscall
adios2::core::engine::SstReader::BeginStep(SstReader *this,StepMode Mode,float timeout_sec)

{
  SstStream p_Var1;
  IO *pIVar2;
  long lVar3;
  _SstData *p_Var4;
  SstStatusValue SVar5;
  int iVar6;
  SstFullMetadata p_Var7;
  BP5Deserializer *pBVar8;
  size_t sVar9;
  SstMetaMetaList __ptr;
  SstBlock p_Var10;
  BP3Deserializer *pBVar11;
  undefined8 uVar12;
  StepStatus SVar13;
  StepStatus SVar14;
  SstMetaMetaList p_Var15;
  char **ppcVar16;
  MetaMetaInfoBlock MM;
  ScopedTimer __var2293;
  undefined1 local_160 [36];
  float local_13c;
  ScopedTimer local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_13c = timeout_sec;
  if (BeginStep(adios2::StepMode,float)::__var293 == '\0') {
    iVar6 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var293);
    if (iVar6 != 0) {
      uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/sst/SstReader.cpp"
                                   ,
                                   "virtual StepStatus adios2::core::engine::SstReader::BeginStep(StepMode, const float)"
                                   ,0x125);
      BeginStep::__var293 = (void *)ps_timer_create_(uVar12);
      __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var293);
    }
  }
  local_138.m_timer = BeginStep::__var293;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if ((this->super_Engine).m_BetweenStepPairs == true) {
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"Engine","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"SstReader","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"BeginStep","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,
               "BeginStep() is called a second time without an intervening EndStep()","");
    helper::Throw<std::logic_error>((string *)local_160,&local_f0,&local_110,&local_130,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_);
    }
  }
  if (Mode < Read) {
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"Engine","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"SstReader","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"BeginStep","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"SstReader::BeginStep inappropriate StepMode specified","");
    helper::Throw<std::invalid_argument>((string *)local_160,&local_f0,&local_110,&local_130,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_);
    }
  }
  Engine::RemoveCreatedVars(&this->super_Engine);
  SVar5 = SstAdvanceStep(this->m_Input,local_13c);
  if (SVar5 == SstSuccess) {
    (this->super_Engine).m_BetweenStepPairs = true;
    SVar13 = OK;
    if (this->m_WriterMarshalMethod == SstMarshalBP) {
      if (BeginStep(adios2::StepMode,float)::__var379 == '\0') {
        iVar6 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var379);
        if (iVar6 != 0) {
          BeginStep::__var379 =
               (void *)ps_timer_create_("BP Marshaling Case - deserialize and install metadata");
          __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var379);
        }
      }
      local_160._0_8_ = BeginStep::__var379;
      if (_perfstubs_initialized == 1) {
        ps_timer_start_();
      }
      p_Var7 = SstGetCurMetadata(this->m_Input);
      this->m_CurrentStepMetaData = p_Var7;
      pBVar11 = (BP3Deserializer *)operator_new(0x490);
      adios2::format::BP3Deserializer::BP3Deserializer(pBVar11,&(this->super_Engine).m_Comm);
      this->m_BP3Deserializer = pBVar11;
      lVar3 = *(long *)(*(long *)pBVar11 + -0x18);
      pIVar2 = (this->super_Engine).m_IO;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"in call to BP3::Open for reading","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sst","");
      adios2::format::BPBase::Init
                ((BPBase *)(&pBVar11->field_0x0 + lVar3),&pIVar2->m_Parameters,&local_70,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pBVar11 = this->m_BP3Deserializer;
      lVar3 = *(long *)(*(long *)pBVar11 + -0x18);
      sVar9 = (*this->m_CurrentStepMetaData->WriterMetadata)->DataSize;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"in SST Streaming Listener","");
      adios2::format::BufferSTL::Resize((BufferSTL *)(&pBVar11->field_0x88 + lVar3),sVar9,&local_b0)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      p_Var4 = *this->m_CurrentStepMetaData->WriterMetadata;
      memcpy(*(void **)(&this->m_BP3Deserializer->field_0xc8 +
                       *(long *)(*(long *)this->m_BP3Deserializer + -0x18)),p_Var4->block,
             p_Var4->DataSize);
      Engine::RemoveCreatedVars(&this->super_Engine);
      pBVar11 = this->m_BP3Deserializer;
      adios2::format::BP3Deserializer::ParseMetadata
                (pBVar11,(BufferSTL *)(&pBVar11->field_0x88 + *(long *)(*(long *)pBVar11 + -0x18)),
                 &this->super_Engine);
      pIVar2 = (this->super_Engine).m_IO;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"in call to SST Reader BeginStep","");
      IO::ResetVariablesStepSelection(pIVar2,true,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)local_160);
      SVar14 = SVar13;
    }
    else {
      SVar14 = OK;
      if (this->m_WriterMarshalMethod == SstMarshalBP5) {
        p_Var7 = SstGetCurMetadata(this->m_Input);
        this->m_CurrentStepMetaData = p_Var7;
        if (this->m_BP5Deserializer == (BP5Deserializer *)0x0) {
          pBVar8 = (BP5Deserializer *)operator_new(0x418);
          adios2::format::BP5Deserializer::BP5Deserializer
                    (pBVar8,this->m_WriterIsRowMajor != 0,(this->Params).IsRowMajor != 0,false,false
                    );
          this->m_BP5Deserializer = pBVar8;
          pBVar8->m_Engine = &this->super_Engine;
        }
        p_Var1 = this->m_Input;
        sVar9 = SstCurrentStep(p_Var1);
        __ptr = SstGetNewMetaMetaData(p_Var1,sVar9);
        if (__ptr != (SstMetaMetaList)0x0) {
          p_Var15 = __ptr;
          do {
            if (p_Var15->BlockData == (char *)0x0) break;
            local_160._16_8_ = p_Var15->ID;
            local_160._24_8_ = p_Var15->IDSize;
            local_160._0_8_ = p_Var15->BlockData;
            local_160._8_8_ = p_Var15->BlockSize;
            adios2::format::BP5Deserializer::InstallMetaMetaData
                      (this->m_BP5Deserializer,(MetaMetaInfoBlock *)local_160);
            p_Var15 = p_Var15 + 1;
          } while (__ptr != (SstMetaMetaList)0x0);
        }
        free(__ptr);
        p_Var1 = this->m_Input;
        sVar9 = SstCurrentStep(p_Var1);
        p_Var10 = SstGetAttributeData(p_Var1,sVar9);
        if (p_Var10 != (SstBlock)0x0) {
          ppcVar16 = &p_Var10->BlockData;
          do {
            if (*ppcVar16 == (char *)0x0) break;
            IO::RemoveAllAttributes((this->super_Engine).m_IO);
            adios2::format::BP5Deserializer::InstallAttributeData
                      (this->m_BP5Deserializer,*ppcVar16,((_SstBlock *)(ppcVar16 + -1))->BlockSize,
                       0xffffffffffffffff);
            ppcVar16 = ppcVar16 + 2;
          } while (p_Var10 != (SstBlock)0x0);
        }
        Engine::RemoveCreatedVars(&this->super_Engine);
        pBVar8 = this->m_BP5Deserializer;
        sVar9 = SstCurrentStep(this->m_Input);
        adios2::format::BP5Deserializer::SetupForStep
                  (pBVar8,sVar9,(long)this->m_CurrentStepMetaData->WriterCohortSize);
        p_Var7 = this->m_CurrentStepMetaData;
        if (0 < p_Var7->WriterCohortSize) {
          sVar9 = 0;
          do {
            adios2::format::BP5Deserializer::InstallMetaData
                      (this->m_BP5Deserializer,p_Var7->WriterMetadata[sVar9]->block,
                       p_Var7->WriterMetadata[sVar9]->DataSize,sVar9,0xffffffffffffffff);
            sVar9 = sVar9 + 1;
            p_Var7 = this->m_CurrentStepMetaData;
          } while ((long)sVar9 < (long)p_Var7->WriterCohortSize);
        }
        pIVar2 = (this->super_Engine).m_IO;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"in call to SST Reader BeginStep","");
        IO::ResetVariablesStepSelection(pIVar2,true,&local_50);
        SVar14 = SVar13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
  }
  else if (SVar5 == SstEndOfStream) {
    SVar14 = EndOfStream;
  }
  else if (SVar5 == SstTimeout) {
    SVar14 = NotReady;
  }
  else {
    SVar14 = OtherError;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_138);
  return SVar14;
}

Assistant:

StepStatus SstReader::BeginStep(StepMode Mode, const float timeout_sec)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    SstStatusValue result;
    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "SstReader", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    switch (Mode)
    {
    case adios2::StepMode::Append:
    case adios2::StepMode::Update:
        helper::Throw<std::invalid_argument>(
            "Engine", "SstReader", "BeginStep",
            "SstReader::BeginStep inappropriate StepMode specified");
    case adios2::StepMode::Read:
        break;
    }
    RemoveCreatedVars();
    result = SstAdvanceStep(m_Input, timeout_sec);
    if (result == SstEndOfStream)
    {
        return StepStatus::EndOfStream;
    }
    if (result == SstTimeout)
    {
        return StepStatus::NotReady;
    }

    if (result != SstSuccess)
    {
        return StepStatus::OtherError;
    }

    m_BetweenStepPairs = true;

    if (m_WriterMarshalMethod == SstMarshalBP5)
    {
        m_CurrentStepMetaData = SstGetCurMetadata(m_Input);
        if (!m_BP5Deserializer)
        {
            m_BP5Deserializer = new format::BP5Deserializer(m_WriterIsRowMajor, Params.IsRowMajor);
            m_BP5Deserializer->m_Engine = this;
        }
        SstMetaMetaList MMList = SstGetNewMetaMetaData(m_Input, SstCurrentStep(m_Input));
        //      m_BP5Deserializer->StepInit(m_IO.m_Parameters,
        //                                "in call to BP5::BeginStep", "bp5");
        int i = 0;
        while (MMList && MMList[i].BlockData)
        {
            format::BP5Base::MetaMetaInfoBlock MM;
            MM.MetaMetaID = MMList[i].ID;
            MM.MetaMetaIDLen = MMList[i].IDSize;
            MM.MetaMetaInfo = MMList[i].BlockData;
            MM.MetaMetaInfoLen = MMList[i].BlockSize;
            m_BP5Deserializer->InstallMetaMetaData(MM);
            i++;
        }
        free(MMList);

        SstBlock AttributeBlockList = SstGetAttributeData(m_Input, SstCurrentStep(m_Input));
        i = 0;
        while (AttributeBlockList && AttributeBlockList[i].BlockData)
        {
            m_IO.RemoveAllAttributes();
            m_BP5Deserializer->InstallAttributeData(AttributeBlockList[i].BlockData,
                                                    AttributeBlockList[i].BlockSize);
            i++;
        }

        RemoveCreatedVars();
        m_BP5Deserializer->SetupForStep(
            SstCurrentStep(m_Input), static_cast<size_t>(m_CurrentStepMetaData->WriterCohortSize));

        for (int i = 0; i < m_CurrentStepMetaData->WriterCohortSize; i++)
        {
            struct _SstData *tmp = m_CurrentStepMetaData->WriterMetadata[i];
            m_BP5Deserializer->InstallMetaData(tmp->block, tmp->DataSize, i);
        }

        m_IO.ResetVariablesStepSelection(true, "in call to SST Reader BeginStep");
    }
    else if (m_WriterMarshalMethod == SstMarshalBP)
    {
        PERFSTUBS_SCOPED_TIMER("BP Marshaling Case - deserialize and install metadata");
        m_CurrentStepMetaData = SstGetCurMetadata(m_Input);
        // At begin step, you get metadata from the writers.  You need to
        // use this for two things: First, you need to create the
        // appropriate variables on the reader side to represent what has
        // been written.  Second, you must keep the metadata around (or a
        // summary structure that represents its contents), so that you can
        // look at it in DoGets* and issue the appropriate
        // ReadRemoteMemory() requests to the writers.  This is because the
        // full data isn't here yet.  We don't know what we'll need on this
        // reader, and we don't want to send *all* data from *all* writers
        // here because that's not scalable.  So, we'll fetch what we need.
        // This is one of the core ideas of SST.

        //   Further clarification:
        //   m_CurrentStepMetaData is a struct like this:

        //     struct _SstFullMetadata
        //     {
        //       int WriterCohortSize;
        //       struct _SstData **WriterMetadata;
        //       void **DP_TimestepInfo;
        //     };

        //   WriterMetadata has an element for each Writer rank
        //   (WriterCohortSize).  WriterMetadata[i] is a pointer to (a copy
        //   of) the SstData block of Metadata that was passed to
        //   SstProvideTimestep by Writer rank i.  SST has simply gathered
        //   them and provided them to each reader.  The DP_TimestepInfo is
        //   for the DataPlane, and DP_TimestepInfo[i] should be passed as
        //   the DP_TimestepInfo parameter when a SstReadRemoteMemory call
        //   is made requesting rank i.  (This may contain MR keys, or
        //   anything else that the Data Plane needs for efficient RDMA on
        //   whatever transport it is using.  But it is opaque to the Engine
        //   (and to the control plane).)

        m_BP3Deserializer = new format::BP3Deserializer(m_Comm);
        m_BP3Deserializer->Init(m_IO.m_Parameters, "in call to BP3::Open for reading", "sst");

        m_BP3Deserializer->m_Metadata.Resize((*m_CurrentStepMetaData->WriterMetadata)->DataSize,
                                             "in SST Streaming Listener");

        std::memcpy(m_BP3Deserializer->m_Metadata.m_Buffer.data(),
                    (*m_CurrentStepMetaData->WriterMetadata)->block,
                    (*m_CurrentStepMetaData->WriterMetadata)->DataSize);

        RemoveCreatedVars();
        m_BP3Deserializer->ParseMetadata(m_BP3Deserializer->m_Metadata, *this);
        m_IO.ResetVariablesStepSelection(true, "in call to SST Reader BeginStep");
    }
    else if (m_WriterMarshalMethod == SstMarshalFFS)
    {
        // For FFS-based marshaling, SstAdvanceStep takes care of installing
        // the metadata, creating variables using the varFFScallback and
        // arrayFFScallback, so there's nothing to be done now.  This
        // comment is just for clarification.
    }
    else
    {
        // unknown marshaling method, shouldn't happen
    }

    return StepStatus::OK;
}